

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

bool QtPrivate::isBuiltinType(QByteArray *type)

{
  long lVar1;
  QByteArrayView typeName;
  bool bVar2;
  int iVar3;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int id;
  int in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  bool bVar4;
  undefined4 in_stack_ffffffffffffffc4;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI)
  ;
  typeName.m_data._0_7_ = in_stack_ffffffffffffffd0;
  typeName.m_size = (qsizetype)in_RDI;
  typeName.m_data._7_1_ = in_stack_ffffffffffffffd7;
  QMetaType::fromName(typeName);
  iVar3 = QMetaType::id((QMetaType *)
                        CONCAT44(in_stack_ffffffffffffffc4,
                                 CONCAT13(in_stack_ffffffffffffffc3,
                                          CONCAT12(in_stack_ffffffffffffffc2,
                                                   in_stack_ffffffffffffffc0))),
                        in_stack_ffffffffffffffbc);
  bVar4 = false;
  if (iVar3 == 0) {
    bVar2 = QByteArray::isEmpty((QByteArray *)0x370405);
    bVar4 = false;
    if (!bVar2) {
      bVar4 = ::operator!=((QByteArray *)"void",
                           (char **)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4 == false && iVar3 < 0x10000;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT bool isBuiltinType(const QByteArray &type)
{
    int id = QMetaType::fromName(type).id();
    if (!id && !type.isEmpty() && type != "void")
        return false;
    return (id < QMetaType::User);
}